

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChFunctorArchiveInSpecific<chrono::ChCoordsys<double>_>::CallArchiveInConstructor
          (ChFunctorArchiveInSpecific<chrono::ChCoordsys<double>_> *this,ChArchiveIn *marchive,
          char *classname)

{
  ChExceptionArchive *this_00;
  allocator local_41;
  string local_40 [32];
  char *local_20;
  char *classname_local;
  ChArchiveIn *marchive_local;
  ChFunctorArchiveInSpecific<chrono::ChCoordsys<double>_> *this_local;
  
  local_20 = classname;
  classname_local = (char *)marchive;
  marchive_local = (ChArchiveIn *)this;
  this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"Cannot call CallArchiveInConstructor() for a constructed object.",&local_41);
  ChExceptionArchive::ChExceptionArchive(this_00,(string *)local_40);
  __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChExceptionArchive::~ChExceptionArchive);
}

Assistant:

virtual void CallArchiveInConstructor(ChArchiveIn& marchive, const char* classname)
        { throw (ChExceptionArchive( "Cannot call CallArchiveInConstructor() for a constructed object.")); }